

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

int64_t __thiscall Timer::getNs(Timer *this)

{
  long *in_RDI;
  timespec now;
  timespec local_18;
  
  memset(&local_18,0,0x10);
  clock_gettime(1,&local_18);
  return (local_18.tv_nsec - in_RDI[1]) + (local_18.tv_sec - *in_RDI) * 1000000000;
}

Assistant:

int64_t Timer::getNs() {
  struct timespec now = {};
#ifdef __linux__
  clock_gettime(CLOCK_MONOTONIC, &now);
#elif _WIN32
  clock_gettime_monotonic(&now);
#endif
  return (int64_t)(now.tv_nsec - _startTime.tv_nsec) +
         1000000000 * (now.tv_sec - _startTime.tv_sec);
}